

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O0

void blf_enc(blf_ctx *c,uint32_t *data,uint16_t blocks)

{
  ushort local_2a;
  uint32_t *puStack_28;
  uint16_t i;
  uint32_t *d;
  uint16_t blocks_local;
  uint32_t *data_local;
  blf_ctx *c_local;
  
  puStack_28 = data;
  for (local_2a = 0; local_2a < blocks; local_2a = local_2a + 1) {
    Blowfish_encipher(c,puStack_28,puStack_28 + 1);
    puStack_28 = puStack_28 + 2;
  }
  return;
}

Assistant:

static void
blf_enc(blf_ctx *c, uint32_t *data, uint16_t blocks)
{
    uint32_t *d;
    uint16_t i;

    d = data;
    for(i = 0; i < blocks; i++) {
        Blowfish_encipher(c, d, d + 1);
        d += 2;
    }
}